

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O2

Gia_Man_t * Bmc_CexBuildNetwork2(Gia_Man_t *p,Abc_Cex_t *pCex,int fStart)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  int iVar17;
  
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x86,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->nPis != p->vCis->nSize) {
    __assert_fail("pCex->nPis == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x87,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->iFrame < fStart) {
    __assert_fail("fStart <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x88,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar4 = Abc_UtilStrsav("unate");
  p_00->pName = pcVar4;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  p->pObjs->Value = 0xffffffff;
  for (iVar17 = 0; iVar17 < p->nRegs; iVar17 = iVar17 + 1) {
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar17);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar9 = ((p->vCis->nSize * (fStart + 1) + pCex->nRegs) - p->nRegs) + iVar17;
    *(ulong *)pGVar5 =
         *(ulong *)pGVar5 & 0xbfffffffbfffffff |
         (ulong)(((uint)(&pCex[1].iPo)[iVar9 >> 5] >> ((byte)iVar9 & 0x1f) & 1) << 0x1e);
    iVar9 = Gia_ManAppendCi(p_00);
    uVar1 = Abc_LitNotCond(iVar9,(uint)((*(uint *)pGVar5 >> 0x1e & 1) == 0));
    pGVar5->Value = uVar1;
  }
  Gia_ManHashAlloc(p_00);
  iVar17 = p->vCis->nSize * fStart + pCex->nRegs;
  do {
    if (pCex->iFrame < fStart) {
      Gia_ManHashStop(p_00);
      if (iVar17 != pCex->nBits) {
        __assert_fail("iBit == pCex->nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd0,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      pGVar5 = Gia_ManPo(p,pCex->iPo);
      if (((uint)*(ulong *)pGVar5 >> 0x1e & 1) == 0) {
        __assert_fail("pObj->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd3,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      if ((*(ulong *)pGVar5 & 0x4000000000000000) != 0) {
        __assert_fail("pObj->fMark1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd4,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      if (pGVar5->Value != 0) {
        Gia_ManAppendCo(p_00,pGVar5->Value);
        pGVar8 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar8;
      }
      __assert_fail("pObj->Value > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                    ,0xd5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
    }
    iVar9 = 0;
    while( true ) {
      iVar13 = iVar9 + iVar17;
      iVar2 = p->nRegs;
      if (p->vCis->nSize - iVar2 <= iVar9) break;
      pGVar5 = Gia_ManCi(p,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        iVar2 = p->nRegs;
        break;
      }
      *(ulong *)pGVar5 =
           *(ulong *)pGVar5 & 0xbfffffffbfffffff | 0x4000000000000000 |
           (ulong)(((uint)(&pCex[1].iPo)[iVar13 >> 5] >> ((byte)iVar13 & 0x1f) & 1) << 0x1e);
      pGVar5->Value = 0xffffffff;
      iVar9 = iVar9 + 1;
    }
    iVar17 = iVar13 + iVar2;
    for (iVar9 = 0; iVar9 < iVar2; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManCo(p,(p->vCos->nSize - iVar2) + iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)pGVar5;
      uVar7 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar7 & 0xffffffffbfffffff | uVar15 & 0x40000000;
      *(ulong *)pGVar6 =
           uVar7 & 0xbfffffffbfffffff | uVar15 & 0x40000000 | *(ulong *)pGVar5 & 0x4000000000000000;
      pGVar6->Value = pGVar5->Value;
      iVar2 = p->nRegs;
    }
    for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManObj(p,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)pGVar5;
      uVar7 = uVar15 & 0x1fffffff;
      if (uVar7 != 0x1fffffff && -1 < (int)uVar15) {
        pGVar6 = pGVar5 + -uVar7;
        uVar3 = *(uint *)(pGVar5 + -uVar7) >> 0x1e & 1;
        uVar1 = (uint)(uVar15 >> 0x1d);
        uVar10 = uVar1 & 1;
        uVar14 = (uint)(uVar15 >> 0x20);
        uVar12 = (ulong)(uVar14 & 0x1fffffff);
        pGVar16 = pGVar5 + -uVar12;
        uVar11 = *(uint *)(pGVar5 + -uVar12) >> 0x1e & 1;
        uVar14 = uVar14 >> 0x1d & 1;
        uVar1 = (uVar11 ^ uVar14) & (*(uint *)(pGVar5 + -uVar7) >> 0x1e ^ uVar1 & 7);
        uVar7 = (ulong)(uVar1 << 0x1e);
        *(ulong *)pGVar5 = uVar15 & 0xffffffff3fffffff | uVar7;
        if (uVar1 == 0) {
          if ((uVar3 == uVar10) && (uVar11 == uVar14)) {
            uVar7 = *(ulong *)pGVar16 | *(ulong *)pGVar6;
          }
          else if (uVar3 == uVar10) {
            uVar7 = *(ulong *)pGVar6;
          }
          else {
            if (uVar11 != uVar14) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                            ,0xb8,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
            }
            uVar7 = *(ulong *)pGVar16;
          }
          uVar15 = uVar15 & 0xbfffffff3fffffff | uVar7 & 0x4000000000000000;
        }
        else {
          uVar15 = uVar15 & 0xbfffffff3fffffff | uVar7 |
                   *(ulong *)pGVar6 & 0x4000000000000000 & *(ulong *)pGVar16;
        }
        *(ulong *)pGVar5 = uVar15;
        pGVar5->Value = 0xffffffff;
        if ((uVar15 & 0x4000000000000000) == 0) {
          if ((uint)uVar15 >> 0x1e == 0) {
            if ((uVar3 == uVar10) && (uVar11 == uVar14)) {
              uVar1 = Gia_ManHashOr(p_00,pGVar5[-(uVar15 & 0x1fffffff)].Value,
                                    pGVar5[-(uVar15 >> 0x20 & 0x1fffffff)].Value);
            }
            else {
              if (uVar3 != uVar10) {
                if (uVar11 != uVar14) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                                ,0xc4,
                                "Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
                }
                uVar15 = uVar15 >> 0x20;
              }
              uVar1 = pGVar5[-(ulong)((uint)uVar15 & 0x1fffffff)].Value;
            }
          }
          else {
            uVar1 = Gia_ManHashAnd(p_00,pGVar5[-(uVar15 & 0x1fffffff)].Value,
                                   pGVar5[-(uVar15 >> 0x20 & 0x1fffffff)].Value);
          }
          pGVar5->Value = uVar1;
          if (uVar1 == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                          ,0xc5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
          }
        }
      }
    }
    for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManCo(p,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)pGVar5;
      uVar7 = (ulong)((uint)uVar15 & 0x1fffffff);
      uVar12 = (ulong)(((uint)uVar15 * 2 ^ *(uint *)(pGVar5 + -uVar7)) & 0x40000000);
      *(ulong *)pGVar5 = uVar15 & 0xffffffffbfffffff | uVar12;
      *(ulong *)pGVar5 =
           uVar15 & 0xbfffffffbfffffff | uVar12 | *(ulong *)(pGVar5 + -uVar7) & 0x4000000000000000;
      pGVar5->Value = pGVar5[-uVar7].Value;
    }
    fStart = fStart + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork2( Gia_Man_t * p, Abc_Cex_t * pCex, int fStart )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCex->nRegs == 0 );
    assert( pCex->nPis == Gia_ManCiNum(p) );
    assert( fStart <= pCex->iFrame );
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0; // value
    Gia_ManConst0(p)->fMark1 = 1; // care
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = Abc_InfoHasBit( pCex->pData, pCex->nRegs + fStart * Gia_ManCiNum(p) + Gia_ManPiNum(p) + k );
        pObj->fMark1 = 0;
        pObj->Value  = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObj->fMark0 );
    }
    Gia_ManHashAlloc( pNew );
    iBit = pCex->nRegs + fStart * Gia_ManCiNum(p);
    for ( i = fStart; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 1;
            pObj->Value  = ~0;
        }
        iBit += Gia_ManRegNum(p);
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}